

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O2

GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *
__thiscall
rapidjson::internal::Stack<rapidjson::CrtAllocator>::
Pop<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
          (Stack<rapidjson::CrtAllocator> *this,size_t count)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar1;
  RapidJSONException *this_00;
  
  if (count * 0x10 <= (ulong)((long)this->stackTop_ - (long)this->stack_)) {
    pGVar1 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)(this->stackTop_ + count * -0x10);
    this->stackTop_ = (char *)pGVar1;
    return pGVar1;
  }
  this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
  cereal::RapidJSONException::RapidJSONException
            (this_00,"rapidjson internal assertion failure: GetSize() >= count * sizeof(T)");
  __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t GetSize() const { return static_cast<size_t>(stackTop_ - stack_); }